

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

bool commandLineOffOnOk(HighsLogOptions *report_log_options,string *name,string *value)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(value,&kHighsOffString_abi_cxx11_);
  bVar2 = true;
  if (!_Var1) {
    _Var1 = std::operator==(value,&kHighsOnString_abi_cxx11_);
    if (!_Var1) {
      bVar2 = false;
      highsLogUser(report_log_options,kWarning,
                   "Value \"%s\" for %s option is not one of \"%s\" or \"%s\"\n",
                   (value->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,
                   kHighsOffString_abi_cxx11_._M_dataplus._M_p,
                   kHighsOnString_abi_cxx11_._M_dataplus._M_p);
    }
  }
  return bVar2;
}

Assistant:

bool commandLineOffOnOk(const HighsLogOptions& report_log_options,
                        const string& name, const string& value) {
  if (value == kHighsOffString || value == kHighsOnString) return true;
  highsLogUser(report_log_options, HighsLogType::kWarning,
               "Value \"%s\" for %s option is not one of \"%s\" or \"%s\"\n",
               value.c_str(), name.c_str(), kHighsOffString.c_str(),
               kHighsOnString.c_str());
  return false;
}